

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsObjectHasProperty(JsValueRef object,JsValueRef propertyId,bool *hasProperty)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode JVar5;
  RecyclableObject *this;
  undefined4 *puVar6;
  JsrtContext *pJVar7;
  TTDRecorder *_actionEntryPopper;
  TTDRecorder *_actionEntryPopper_00;
  ScriptContext *__localScriptContext;
  AutoNestedHandledExceptionType *this_00;
  Type TVar8;
  void *unaff_retaddr;
  anon_class_24_3_2776ca25 local_d0;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_78 [8];
  EnterScriptObject __enterScriptObject;
  JsValueRef propertyId_local;
  bool *hasProperty_local;
  JsValueRef object_local;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (object == (JsValueRef)0x0) {
    JVar5 = JsErrorInvalidArgument;
  }
  else {
    __enterScriptObject.library = (JavascriptLibrary *)propertyId;
    propertyId_local = hasProperty;
    hasProperty_local = (bool *)object;
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      return JsErrorArgumentNotObject;
    }
    this = Js::VarTo<Js::RecyclableObject>(hasProperty_local);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0037741e;
      *puVar6 = 0;
    }
    TVar8 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar4 = Js::RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_0037741e;
      *puVar6 = 0;
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while (TVar8 != TypeIds_Null) {
      if (TVar8 == TypeIds_Proxy) {
        local_d0.object = &hasProperty_local;
        local_d0.propertyId = &__enterScriptObject.library;
        local_d0.hasProperty = (bool **)&propertyId_local;
        pJVar7 = JsrtContext::GetCurrent();
        if (pJVar7 == (JsrtContext *)0x0) {
          return JsErrorNoCurrentContext;
        }
        pSVar1 = (((pJVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)((long)&object_local + 4),
                   ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
        __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
        __entryExitRecord.scriptContext = (ScriptContext *)0x0;
        __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
        __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
        auStack_b8 = (undefined1  [8])0x0;
        __entryExitRecord._0_1_ = 0;
        __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
        __entryExitRecord._2_6_ = 0;
        __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
        Js::EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)local_78,pSVar1,(ScriptEntryExitRecord *)auStack_b8,
                   unaff_retaddr,&stack0x00000000,true,true,true);
        Js::ScriptContext::OnScriptStart(pSVar1,true,true);
        Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_78);
        JVar5 = JsObjectHasProperty::anon_class_24_3_2776ca25::operator()
                          (&local_d0,pSVar1,_actionEntryPopper);
        Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_78);
        if (((JVar5 & 0x6ffff) == JsErrorOutOfMemory) ||
           ((((JVar5 - JsErrorNoCurrentContext < 7 &&
              ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
             (JVar5 == JsErrorFatal)) || (JVar5 == JsErrorScriptTerminated)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                             ,0xcc,
                             "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                             ,
                             "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                            );
          if (!bVar3) goto LAB_0037741e;
          *puVar6 = 0;
        }
        this_00 = (AutoNestedHandledExceptionType *)((long)&object_local + 4);
        goto LAB_00376ee4;
      }
      this = Js::RecyclableObject::GetPrototype(this);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_0037741e;
        *puVar6 = 0;
      }
      TVar8 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar8) && (BVar4 = Js::RecyclableObject::IsExternal(this), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_0037741e;
        *puVar6 = 0;
      }
    }
    local_78 = (undefined1  [8])&hasProperty_local;
    __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)&__enterScriptObject.library;
    __enterScriptObject._8_8_ = &propertyId_local;
    pJVar7 = JsrtContext::GetCurrent();
    JVar5 = JsErrorNoCurrentContext;
    if (pJVar7 != (JsrtContext *)0x0) {
      pSVar1 = (((pJVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_b8,
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      JVar5 = JsObjectHasProperty::anon_class_24_3_2776ca25::operator()
                        ((anon_class_24_3_2776ca25 *)local_78,pSVar1,_actionEntryPopper_00);
      if (((JVar5 - JsErrorNoCurrentContext < 7) &&
          ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
         ((JVar5 == JsErrorOutOfMemory ||
          ((JVar5 == JsErrorFatal || ((JVar5 & 0xfffffffd) == JsErrorScriptException)))))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0x11f,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar3) {
LAB_0037741e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      this_00 = (AutoNestedHandledExceptionType *)auStack_b8;
LAB_00376ee4:
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(this_00);
    }
  }
  return JVar5;
}

Assistant:

CHAKRA_API JsObjectHasProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ bool *hasProperty)
{
    VALIDATE_JSREF(object);
    if (!Js::JavascriptOperators::IsObject(object)) return JsErrorArgumentNotObject;

    auto internalHasProperty = [&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(hasProperty);
        *hasProperty = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        *hasProperty = Js::JavascriptOperators::HasProperty(instance, propertyRecord->GetPropertyId()) != 0;

        return JsNoError;
    };

    Js::RecyclableObject* robject = Js::VarTo<Js::RecyclableObject>(object);
    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(robject);
    while (typeId != Js::TypeIds_Null && typeId != Js::TypeIds_Proxy)
    {
        robject = robject->GetPrototype();
        typeId = Js::JavascriptOperators::GetTypeId(robject);
    }

    if (typeId == Js::TypeIds_Proxy)
    {
        return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
    }
    else if (typeId == Js::TypeIds_Object)
    {
        // CEOs can also have traps so we would want the Enter/Leave semantics for those.
        Js::CustomExternalWrapperObject * externalWrapper = Js::JavascriptOperators::TryFromVar<Js::CustomExternalWrapperObject>(object);
        if (externalWrapper)
        {
            return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
        }
    }

    return ContextAPINoScriptWrapper(internalHasProperty);
}